

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_r2.cpp
# Opt level: O3

AggregateFunction * duckdb::RegrR2Fun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  LogicalType::LogicalType(&local_38,DOUBLE);
  LogicalType::LogicalType(&local_50,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrR2State,double,double,double,duckdb::RegrR2Operation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,&local_38,&local_50,in_R8);
  LogicalType::~LogicalType(&local_50);
  LogicalType::~LogicalType(&local_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction RegrR2Fun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrR2State, double, double, double, RegrR2Operation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}